

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_cs.cpp
# Opt level: O0

CallResultWrap * tapi_query_trades(void *h,char *account_id,char *codes)

{
  bool bVar1;
  CallResultWrap *pCVar2;
  element_type *this;
  TradeWrap *this_00;
  vector<TradeWrap_*,_std::allocator<TradeWrap_*>_> *pvVar3;
  TradeWrap **ppTVar4;
  size_type sVar5;
  char *pcVar6;
  TradeWrap *local_f8;
  reference local_f0;
  Trade *tmp;
  const_iterator __end2;
  const_iterator __begin2;
  element_type *__range2;
  CallResultWrap *local_c0;
  CallResultWrap *cr;
  string local_b0 [55];
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [8];
  CallResult<const_std::vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>_> r;
  TradeApi *tapi;
  char *codes_local;
  char *account_id_local;
  void *h_local;
  
  r._40_8_ = h;
  if (h != (void *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,account_id,&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,codes,(allocator *)((long)&cr + 7));
    (**(code **)(*h + 0x38))(local_58,h,local_78,local_b0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cr + 7));
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    pCVar2 = (CallResultWrap *)operator_new(0x10c);
    CallResultWrap::CallResultWrap(pCVar2);
    local_c0 = pCVar2;
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_58);
    if (bVar1) {
      std::make_shared<_WrapArray<TradeWrap>>();
      std::shared_ptr<_WrapArray<TradeWrap>_>::operator=
                (&local_c0->trades,(shared_ptr<_WrapArray<TradeWrap>_> *)&__range2);
      std::shared_ptr<_WrapArray<TradeWrap>_>::~shared_ptr
                ((shared_ptr<_WrapArray<TradeWrap>_> *)&__range2);
      this = std::
             __shared_ptr_access<const_std::vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_std::vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_58);
      __end2 = std::vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>::begin(this);
      tmp = (Trade *)std::vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>::end(this)
      ;
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<const_tquant::api::Trade_*,_std::vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>_>
                                    *)&tmp);
        if (!bVar1) break;
        local_f0 = __gnu_cxx::
                   __normal_iterator<const_tquant::api::Trade_*,_std::vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>_>
                   ::operator*(&__end2);
        pvVar3 = &std::
                  __shared_ptr_access<_WrapArray<TradeWrap>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<_WrapArray<TradeWrap>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&local_c0->trades)->wraps;
        this_00 = (TradeWrap *)operator_new(0x10c);
        TradeWrap::TradeWrap(this_00,local_f0);
        local_f8 = this_00;
        std::vector<TradeWrap_*,_std::allocator<TradeWrap_*>_>::push_back(pvVar3,&local_f8);
        __gnu_cxx::
        __normal_iterator<const_tquant::api::Trade_*,_std::vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>_>
        ::operator++(&__end2);
      }
      pvVar3 = &std::
                __shared_ptr_access<_WrapArray<TradeWrap>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<_WrapArray<TradeWrap>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&local_c0->trades)->wraps;
      ppTVar4 = std::vector<TradeWrap_*,_std::allocator<TradeWrap_*>_>::data(pvVar3);
      local_c0->value = ppTVar4;
      local_c0->element_size = 0x10c;
      pvVar3 = &std::
                __shared_ptr_access<_WrapArray<TradeWrap>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<_WrapArray<TradeWrap>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&local_c0->trades)->wraps;
      sVar5 = std::vector<TradeWrap_*,_std::allocator<TradeWrap_*>_>::size(pvVar3);
      local_c0->element_count = (int32_t)sVar5;
      local_c0->value_type = 9;
    }
    else {
      pcVar6 = _T((string *)
                  &r.value.
                   super___shared_ptr<const_std::vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount,&local_c0->_msg);
      local_c0->msg = pcVar6;
    }
    pCVar2 = local_c0;
    tquant::api::
    CallResult<const_std::vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>_>::
    ~CallResult((CallResult<const_std::vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>_>
                 *)local_58);
    return pCVar2;
  }
  __assert_fail("tapi",
                "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/c/api/tqapi_cs.cpp"
                ,0x154,"CallResultWrap *tapi_query_trades(void *, const char *, const char *)");
}

Assistant:

_TQAPI_EXPORT
CallResultWrap* tapi_query_trades(void* h, const char* account_id, const char* codes)
{
    auto tapi = reinterpret_cast<TradeApi*>(h);
    assert(tapi);

    auto r = tapi->query_trades(account_id, codes);
    CallResultWrap* cr = new CallResultWrap();
    if (r.value) {
		cr->trades = make_shared<TradeWrapArray>();
        for (auto& tmp : *r.value)
            cr->trades->wraps.push_back(new TradeWrap(&tmp));

        cr->value = reinterpret_cast<const void*>(cr->trades->wraps.data());
        cr->element_size = sizeof(TradeWrap);
        cr->element_count = (int32_t)cr->trades->wraps.size();
        cr->value_type = VT_TRADE_ARRAY;
    }
    else {
		cr->msg = _T(r.msg, cr->_msg);
    }
    return cr;
}